

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flt2vrml.c
# Opt level: O1

int profitCB(void *mystate,void *ud)

{
  byte bVar1;
  uint16_t uVar2;
  short sVar3;
  short sVar4;
  bool bVar5;
  void **ppvVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  bool_t bVar10;
  uint uVar11;
  prf_node_t *ppVar12;
  uint32_t *puVar13;
  matrix4x4_f32_t *m;
  undefined8 *item;
  void *pvVar14;
  int *piVar15;
  size_t sVar16;
  char *__dest;
  long lVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  prf_vertex_s vertex;
  float local_118;
  float fStack_114;
  float fStack_110;
  undefined1 local_108 [16];
  double local_f8;
  ushort local_f0;
  ushort local_ee;
  float local_e0;
  float local_dc;
  uint local_d8;
  int local_cc;
  
  ppVar12 = *(prf_node_t **)((long)mystate + 8);
  uVar2 = ppVar12->opcode;
  if (uVar2 == 0x3e) {
    return 2;
  }
  if (uVar2 == 0x3d) {
    ppVar12 = prf_state_get_instance_from_node((prf_state_t *)mystate,ppVar12);
    if (ppVar12 == (prf_node_t *)0x0) {
      array_count(*(void **)((long)mystate + 0x40));
    }
    else {
      uVar11 = array_count(ppVar12->children);
      prf_state_push((prf_state_t *)mystate);
      if (0 < (int)uVar11) {
        uVar19 = 0;
        do {
          prf_model_traverse_io_(ppVar12->children[uVar19],(prf_state_t *)mystate);
          uVar19 = uVar19 + 1;
        } while (uVar11 != uVar19);
      }
      prf_state_pop((prf_state_t *)mystate);
    }
  }
  else {
    if ((uVar2 == 2) && ((ppVar12->data[0xf] & 0x60) != 0)) {
      prf_state_push((prf_state_t *)mystate);
      prf_model_traverse_io_
                (*(prf_node_t **)(*(long *)(*(long *)((long)mystate + 8) + 0x10) + 8),
                 (prf_state_t *)mystate);
      prf_state_pop((prf_state_t *)mystate);
      return 2;
    }
    prf_nodeinfo_get(uVar2);
    ppVar12 = *(prf_node_t **)((long)mystate + 8);
    uVar2 = ppVar12->opcode;
    if (uVar2 == 5) {
      vertexarray = (float *)_array_set_count(vertexarray,0);
      texcoordarray = (float *)_array_set_count(texcoordarray,0);
      colorarray = (int *)_array_set_count(colorarray,0);
      lVar20 = *(long *)(*(long *)((long)mystate + 8) + 8);
      if ((*(uint *)(lVar20 + 0x28) >> 0x1a & 1) != 0) {
        return 2;
      }
      profitCB_is_in_face = 1;
      profitCB_color_per_vertex = (*(byte *)(lVar20 + 0x2c) | 2) == 3;
      if ((*(uint *)(lVar20 + 0x28) & 0x50000000) == 0) {
        if (ofversion < 0x5dc) {
          uVar11 = (uint)*(ushort *)(lVar20 + 0x10);
        }
        else {
          uVar11 = *(uint *)(lVar20 + 0x40);
        }
        uVar11 = my_palette_lookup((prf_state_t *)mystate,uVar11);
      }
      else {
        uVar11 = *(uint *)(lVar20 + 0x34);
      }
      sVar3 = *(short *)(lVar20 + 0x18);
      sVar4 = *(short *)(lVar20 + 0x1a);
      iVar18 = (uint)*(ushort *)((long)mystate + 0x74) * (uint)*(ushort *)(lVar20 + 0x24);
      bVar1 = *(byte *)(lVar20 + 0x2c);
      local_118 = (float)uVar11;
      fStack_114 = (float)(int)sVar4 * 65536.0 + (float)(int)sVar3;
      fStack_110 = (float)*(ushort *)((long)mystate + 0x78) * 65536.0 * 256.0 +
                   (float)bVar1 * 65536.0 + (float)(iVar18 >> 0x10);
      iVar8 = bsp_add_point(materialLookup,&local_118);
      profitCB::current_index = iVar8;
      iVar9 = array_count(facesets);
      if (iVar9 <= iVar8) {
        item = (undefined8 *)malloc(0xa0);
        item[8] = 0;
        pvVar14 = bsp_create(3);
        *item = pvVar14;
        pvVar14 = bsp_create(2);
        item[1] = pvVar14;
        piVar15 = array_create_int(4);
        item[3] = piVar15;
        piVar15 = array_create_int(4);
        item[4] = piVar15;
        piVar15 = array_create_int(4);
        item[5] = piVar15;
        piVar15 = array_create_int(4);
        item[2] = piVar15;
        pvVar14 = bsp_create(3);
        item[6] = pvVar14;
        *(uint *)(item + 7) = uVar11;
        *(short *)((long)item + 0x3c) = sVar3;
        item[8] = 0;
        *(uint *)((long)item + 0x9c) = (uint)*(ushort *)((long)mystate + 0x78);
        if (((-1 < sVar3) &&
            (bVar10 = prf_state_texture_lookup
                                ((prf_state_t *)mystate,(int)sVar3,(prf_texture_t *)local_108),
            bVar10 != 0)) && (sVar16 = strlen(local_108), sVar16 != 0)) {
          __dest = (char *)malloc(sVar16 + 1);
          item[8] = __dest;
          strcpy(__dest,local_108);
        }
        *(short *)(item + 9) = sVar4;
        *(short *)((long)item + 0x4a) = (short)((uint)iVar18 >> 0x10);
        *(ushort *)((long)item + 0x4c) = (ushort)bVar1;
        bVar10 = prf_state_material_lookup
                           ((prf_state_t *)mystate,(int)sVar4,(prf_material_t *)(item + 10));
        if (bVar10 == 0) {
          *(undefined8 *)((long)item + 0x74) = 0x3f8000003f800000;
          *(undefined8 *)((long)item + 0x7c) = 0x3f8000003f800000;
          *(undefined8 *)((long)item + 100) = 0x3e4ccccd3e4ccccd;
          *(undefined8 *)((long)item + 0x6c) = 0x3f8000003e4ccccd;
          auVar23._0_12_ = ZEXT812(0x3f800000);
          auVar23._12_4_ = 0;
          *(undefined1 (*) [16])((long)item + 0x84) = auVar23;
          *(undefined8 *)((long)item + 0x94) = 0x3f80000041cccccd;
        }
        facesets = _array_append_ptr(facesets,item);
      }
      pvVar14 = *(void **)(*(long *)((long)mystate + 8) + 0x10);
      if (pvVar14 != (void *)0x0) {
        uVar11 = array_count(pvVar14);
        prf_state_push((prf_state_t *)mystate);
        if (0 < (int)uVar11) {
          uVar19 = 0;
          bVar5 = false;
          do {
            ppVar12 = *(prf_node_t **)((long)pvVar14 + uVar19 * 8);
            if (ppVar12->opcode == 0x13) {
              bVar5 = true;
            }
            if (!bVar5) {
              prf_model_traverse_io_(ppVar12,(prf_state_t *)mystate);
            }
            if (**(short **)((long)pvVar14 + uVar19 * 8) == 0x14) {
              bVar5 = false;
            }
            uVar19 = uVar19 + 1;
          } while (uVar11 != uVar19);
        }
        prf_state_pop((prf_state_t *)mystate);
        prf_state_push((prf_state_t *)mystate);
        if (0 < (int)uVar11) {
          uVar19 = 0;
          bVar5 = false;
          do {
            ppVar12 = *(prf_node_t **)((long)pvVar14 + uVar19 * 8);
            if (ppVar12->opcode == 0x13) {
              bVar5 = true;
            }
            if (bVar5) {
              prf_model_traverse_io_(ppVar12,(prf_state_t *)mystate);
            }
            if (**(short **)((long)pvVar14 + uVar19 * 8) == 0x14) {
              bVar5 = false;
            }
            uVar19 = uVar19 + 1;
          } while (uVar11 != uVar19);
        }
        prf_state_pop((prf_state_t *)mystate);
      }
      return 2;
    }
    if (uVar2 == 0x48 && (~profitCB_is_in_face & 1) == 0) {
      uVar11 = prf_vertex_list_get_count(ppVar12);
      puVar13 = prf_vertex_list_get_list_ptr(*(prf_node_t **)((long)mystate + 8));
      if ((int)uVar11 < 1) {
        return 1;
      }
      uVar19 = 0;
      do {
        prf_model_vertex_palette_lookup(currmodel,puVar13[uVar19],(prf_vertex_t *)local_108);
        vertexarray = _array_append_float(vertexarray,(float)(double)local_108._0_8_);
        vertexarray = _array_append_float(vertexarray,(float)(double)local_108._8_8_);
        vertexarray = _array_append_float(vertexarray,(float)local_f8);
        if (local_cc == 0) {
          texcoordarray = _array_append_float(texcoordarray,0.0);
          fVar21 = 0.0;
        }
        else {
          texcoordarray = _array_append_float(texcoordarray,local_e0);
          fVar21 = local_dc;
        }
        texcoordarray = _array_append_float(texcoordarray,fVar21);
        piVar15 = colorarray;
        if (profitCB_color_per_vertex == '\x01') {
          if ((local_ee >> 0xd & 1) == 0) {
            uVar7 = local_d8;
            if ((local_ee >> 0xc & 1) == 0) {
              uVar7 = my_palette_lookup((prf_state_t *)mystate,(uint)local_f0);
            }
          }
          else {
            uVar7 = *(uint *)((long)facesets[profitCB::current_index] + 0x38);
          }
          colorarray = _array_append_int(piVar15,uVar7);
        }
        uVar19 = uVar19 + 1;
      } while (uVar11 != uVar19);
    }
    else if (uVar2 == 0x59 && (~profitCB_is_in_face & 1) == 0) {
      iVar8 = prf_morph_vertex_list_get_count(ppVar12);
      puVar13 = prf_morph_vertex_list_get_list_ptr(*(prf_node_t **)((long)mystate + 8));
      if (0 < iVar8) {
        uVar19 = 0;
        do {
          prf_model_vertex_palette_lookup(currmodel,puVar13[uVar19],(prf_vertex_t *)local_108);
          vertexarray = _array_append_float(vertexarray,(float)(double)local_108._0_8_);
          vertexarray = _array_append_float(vertexarray,(float)(double)local_108._8_8_);
          vertexarray = _array_append_float(vertexarray,(float)local_f8);
          if (local_cc == 0) {
            texcoordarray = _array_append_float(texcoordarray,0.0);
            fVar21 = 0.0;
          }
          else {
            texcoordarray = _array_append_float(texcoordarray,local_e0);
            fVar21 = local_dc;
          }
          texcoordarray = _array_append_float(texcoordarray,fVar21);
          piVar15 = colorarray;
          if (profitCB_color_per_vertex == '\x01') {
            if ((local_ee >> 0xd & 1) == 0) {
              uVar11 = local_d8;
              if ((local_ee >> 0xc & 1) == 0) {
                uVar11 = my_palette_lookup((prf_state_t *)mystate,(uint)local_f0);
              }
            }
            else {
              uVar11 = *(uint *)((long)facesets[profitCB::current_index] + 0x38);
            }
            colorarray = _array_append_int(piVar15,uVar11);
          }
          uVar19 = uVar19 + 2;
        } while (uVar19 < (uint)(iVar8 * 2));
      }
    }
    else {
      if (((profitCB_is_in_face & 1) != 0) &&
         (bVar10 = prf_vertex_lookup(ppVar12,(prf_vertex_t *)local_108), bVar10 != 0)) {
        vertexarray = _array_append_float(vertexarray,(float)(double)local_108._0_8_);
        vertexarray = _array_append_float(vertexarray,(float)(double)local_108._8_8_);
        vertexarray = _array_append_float(vertexarray,(float)local_f8);
        texcoordarray = _array_append_float(texcoordarray,0.0);
        texcoordarray = _array_append_float(texcoordarray,0.0);
        piVar15 = colorarray;
        if (profitCB_color_per_vertex != '\x01') {
          return 1;
        }
        if ((local_ee >> 0xd & 1) == 0) {
          if ((local_ee >> 0xc & 1) == 0) {
            local_d8 = my_palette_lookup((prf_state_t *)mystate,(uint)local_f0);
          }
        }
        else {
          local_d8 = *(uint *)((long)facesets[profitCB::current_index] + 0x38);
        }
        colorarray = _array_append_int(piVar15,local_d8);
        return 1;
      }
      if (profitCB_is_in_face != 1) {
        return 1;
      }
      if (**(short **)((long)mystate + 8) != 0xb) {
        return 1;
      }
      profitCB_is_in_face = 0;
      m = prf_state_get_matrix((prf_state_t *)mystate);
      iVar8 = array_count(vertexarray);
      if (iVar8 == 3) {
        return 1;
      }
      iVar8 = array_count(vertexarray);
      if (iVar8 != 6) {
        iVar8 = array_count(vertexarray);
        if (iVar8 < 9) {
          return 1;
        }
        sVar3 = *(short *)((long)facesets[profitCB::current_index] + 0x3c);
        uVar11 = array_count(vertexarray);
        if (2 < (int)uVar11) {
          lVar20 = 8;
          uVar19 = 0;
          do {
            local_118 = *(float *)((long)vertexarray + lVar20 + -8);
            fStack_114 = *(float *)((long)vertexarray + lVar20 + -4);
            fStack_110 = *(float *)((long)vertexarray + lVar20);
            mult_matrix_vec((float *)m,&local_118);
            piVar15 = *(int **)((long)facesets[profitCB::current_index] + 0x18);
            iVar8 = bsp_add_point(*(void **)((long)facesets[profitCB::current_index] + 0x30),
                                  &local_118);
            piVar15 = _array_append_int(piVar15,iVar8);
            ppvVar6 = facesets;
            lVar17 = (long)profitCB::current_index;
            *(int **)((long)facesets[lVar17] + 0x18) = piVar15;
            if (-1 < sVar3) {
              local_118 = texcoordarray[uVar19 * 2];
              fStack_114 = texcoordarray[uVar19 * 2 + 1];
              fStack_110 = texcoordarray[uVar19 * 2 + 2];
              piVar15 = *(int **)((long)ppvVar6[lVar17] + 0x28);
              iVar8 = bsp_add_point(*(void **)((long)ppvVar6[lVar17] + 8),&local_118);
              piVar15 = _array_append_int(piVar15,iVar8);
              *(int **)((long)facesets[profitCB::current_index] + 0x28) = piVar15;
            }
            if (profitCB_color_per_vertex == '\x01') {
              uVar7 = colorarray[uVar19];
              auVar25._0_4_ = (float)(uVar7 & 0xff);
              auVar25._4_4_ = (float)(uVar7 & 0xff00);
              auVar25._8_8_ = 0;
              auVar23 = divps(auVar25,_DAT_00110090);
              local_118 = auVar23._0_4_;
              fStack_114 = auVar23._4_4_;
              fStack_110 = (float)(uVar7 & 0xff0000) / 1.671168e+07;
              piVar15 = *(int **)((long)facesets[profitCB::current_index] + 0x10);
              iVar8 = bsp_add_point(*facesets[profitCB::current_index],&local_118);
              piVar15 = _array_append_int(piVar15,iVar8);
              *(int **)((long)facesets[profitCB::current_index] + 0x10) = piVar15;
            }
            uVar19 = uVar19 + 1;
            lVar20 = lVar20 + 0xc;
          } while ((ulong)uVar11 / 3 != uVar19);
        }
        piVar15 = _array_append_int(*(int **)((long)facesets[profitCB::current_index] + 0x18),-1);
        ppvVar6 = facesets;
        lVar20 = (long)profitCB::current_index;
        *(int **)((long)facesets[lVar20] + 0x18) = piVar15;
        if (-1 < sVar3) {
          piVar15 = _array_append_int(*(int **)((long)ppvVar6[lVar20] + 0x28),-1);
          *(int **)((long)facesets[profitCB::current_index] + 0x28) = piVar15;
        }
        if (profitCB_color_per_vertex != '\x01') {
          return 1;
        }
        piVar15 = _array_append_int(*(int **)((long)facesets[profitCB::current_index] + 0x10),-1);
        *(int **)((long)facesets[profitCB::current_index] + 0x10) = piVar15;
        return 1;
      }
      local_118 = *vertexarray;
      fStack_114 = vertexarray[1];
      fStack_110 = vertexarray[2];
      mult_matrix_vec((float *)m,&local_118);
      piVar15 = *(int **)((long)facesets[profitCB::current_index] + 0x20);
      iVar8 = bsp_add_point(*(void **)((long)facesets[profitCB::current_index] + 0x30),&local_118);
      piVar15 = _array_append_int(piVar15,iVar8);
      ppvVar6 = facesets;
      lVar20 = (long)profitCB::current_index;
      *(int **)((long)facesets[lVar20] + 0x20) = piVar15;
      local_118 = vertexarray[3];
      fStack_114 = vertexarray[4];
      fStack_110 = vertexarray[5];
      mult_matrix_vec((float *)m,&local_118);
      piVar15 = *(int **)((long)ppvVar6[lVar20] + 0x20);
      iVar8 = bsp_add_point(*(void **)((long)ppvVar6[lVar20] + 0x30),&local_118);
      piVar15 = _array_append_int(piVar15,iVar8);
      ppvVar6 = facesets;
      lVar20 = (long)profitCB::current_index;
      *(int **)((long)facesets[lVar20] + 0x20) = piVar15;
      piVar15 = _array_append_int(*(int **)((long)ppvVar6[lVar20] + 0x20),-1);
      ppvVar6 = facesets;
      lVar20 = (long)profitCB::current_index;
      *(int **)((long)facesets[lVar20] + 0x20) = piVar15;
      if (profitCB_color_per_vertex == '\x01') {
        uVar11 = *colorarray;
        auVar22._0_4_ = (float)(uVar11 & 0xff);
        auVar22._4_4_ = (float)(uVar11 & 0xff00);
        auVar22._8_8_ = 0;
        auVar23 = divps(auVar22,_DAT_00110090);
        local_118 = auVar23._0_4_;
        fStack_114 = auVar23._4_4_;
        fStack_110 = (float)(uVar11 & 0xff0000) / 1.671168e+07;
        piVar15 = *(int **)((long)ppvVar6[lVar20] + 0x10);
        iVar8 = bsp_add_point(*ppvVar6[lVar20],&local_118);
        piVar15 = _array_append_int(piVar15,iVar8);
        ppvVar6 = facesets;
        lVar20 = (long)profitCB::current_index;
        *(int **)((long)facesets[lVar20] + 0x10) = piVar15;
        uVar11 = colorarray[1];
        auVar24._0_4_ = (float)(uVar11 & 0xff);
        auVar24._4_4_ = (float)(uVar11 & 0xff00);
        auVar24._8_8_ = 0;
        auVar23 = divps(auVar24,_DAT_00110090);
        local_118 = auVar23._0_4_;
        fStack_114 = auVar23._4_4_;
        fStack_110 = (float)(uVar11 & 0xff0000) / 1.671168e+07;
        piVar15 = *(int **)((long)ppvVar6[lVar20] + 0x10);
        iVar8 = bsp_add_point(*ppvVar6[lVar20],&local_118);
        piVar15 = _array_append_int(piVar15,iVar8);
        ppvVar6 = facesets;
        lVar20 = (long)profitCB::current_index;
        *(int **)((long)facesets[lVar20] + 0x10) = piVar15;
        piVar15 = _array_append_int(*(int **)((long)ppvVar6[lVar20] + 0x10),-1);
        *(int **)((long)facesets[profitCB::current_index] + 0x10) = piVar15;
      }
    }
  }
  return 1;
}

Assistant:

static int
profitCB(void *mystate, void *ud)
{
  static int is_in_face = 0;
  static int current_index = -1;
  static int color_per_vertex = 0;
  prf_nodeinfo_t *info;
  int i,n;
  float tmp[3];
  prf_node_t **children;
  struct prf_vertex_s vertex;

  prf_state_t * state = (prf_state_t *)mystate;

  if (state->node->opcode == GROUP_OPCODE) {
    struct prf_group_data *data = (struct prf_group_data*) state->node->data;
    if (data->flags & PRF_GROUP_FLAG_ANIMATION) {
      assert(state->node->children && array_count(state->node->children) > 2);
      prf_state_push(state);
      prf_model_traverse_io_(state->node->children[1], state);
      prf_state_pop(state);
      return PRF_TRAV_SIBLING;
    }
  }
  else if (state->node->opcode == DEF_OPCODE) {
    return PRF_TRAV_SIBLING;
  }
  else if (state->node->opcode == REF_OPCODE) {
    prf_node_t *node = prf_state_get_instance_from_node(state, state->node);
    if (node) {
      int i, n = array_count(node->children);
      prf_state_push(state);
      for (i = 0; i < n; i++) {
	prf_model_traverse_io_(node->children[i], state);
      }
      prf_state_pop(state);
    }
    else {
      int n = array_count(state->instances);
    }
    assert(node);
    return PRF_TRAV_CONTINUE;
  }

  info = prf_nodeinfo_get(state->node->opcode);

  if (state->node->opcode == FACE_OPCODE) {
    struct prf_face_data *face;
    unsigned int packed_color;
    unsigned short lightmode;
    int idx;

    vertexarray=(float *)_array_set_count(vertexarray, 0);
    texcoordarray=(float *)_array_set_count(texcoordarray, 0);
    colorarray=(int *)_array_set_count(colorarray, 0);

    face = (struct prf_face_data*) state->node->data;

    if (!(face->flags & PRF_FACE_FLAGS_HIDDEN)) {
      short texture_pattern_index;
      short material_index;
      unsigned short transparency;
      is_in_face = 1;
      color_per_vertex = 0;
      if (face->light_mode == 1 || face->light_mode == 3) {
        color_per_vertex = 1;
      }

      packed_color = face->color_name_index;

      if (face->flags & 0x50000000) {
        packed_color = face->packed_color_primary;
      }
      else {
        if (ofversion < 1500) {
          packed_color = my_palette_lookup(state, face->color_name_index);
        }
        else {
          packed_color = my_palette_lookup(state, face->primary_color_index);
        }
      }
      texture_pattern_index = face->texture_pattern_index;
      material_index = face->material_index;

      transparency = (unsigned short)
        (((int32_t)(face->transparency) *
          (int32_t)(state->object_transparency)) >> 16);

      lightmode = face->light_mode;

      tmp[0] = (float) packed_color;
      tmp[1] = (float) texture_pattern_index +
        (float) material_index * 65536.0f;
      tmp[2] = (float) transparency +
        (float) lightmode * 65536.0f +
        (float) state->subface_level * 65536.0f * 256.0f;

      idx = bsp_add_point(materialLookup, tmp);
      current_index = idx;

      if (idx >= array_count(facesets)) {
        faceset *data = faceset_create();

        data->packed_color = packed_color;
        data->texture_pattern_index = texture_pattern_index;
        data->texture_pattern_filename = NULL;
        data->subface_level = state->subface_level;

        if (texture_pattern_index >= 0) {
          struct prf_texture_s tex;

          if (prf_state_texture_lookup(state, texture_pattern_index, &tex)) {

            if (strlen(tex.filename)) {
              data->texture_pattern_filename =
                (char *)malloc(strlen(tex.filename)+1);
              strcpy(data->texture_pattern_filename, tex.filename);
            }
          }
        }
         data->material_index = material_index;
         data->transparency = transparency;
         data->lightmode = lightmode;

         if (prf_state_material_lookup(state, material_index,
                                       &data->material)) {
             // FIXME: implement proper action
         }
         else {
           set_default_material(&data->material);
         }

         array_append_ptr(facesets, data);
      }

      children = state->node->children;
      if (children) {
        int insub = 0;
        n = array_count(children);

        prf_state_push(state);
        for (i = 0; i < n; i++) {
          if (children[i]->opcode == PUSH_SUBFACE_OPCODE) insub = 1;
          if (!insub) prf_model_traverse_io_(children[i], state);
          if (children[i]->opcode == POP_SUBFACE_OPCODE) insub = 0;
        }
        prf_state_pop(state);

        prf_state_push(state);
        insub = 0;
        for (i = 0; i < n; i++) {
          if (children[i]->opcode == PUSH_SUBFACE_OPCODE) insub = 1;
          if (insub) prf_model_traverse_io_(children[i], state);
          if (children[i]->opcode == POP_SUBFACE_OPCODE) insub = 0;
        }
        prf_state_pop(state);
      }
    }
    return PRF_TRAV_SIBLING; /* finished traversing face */
  }

  if (is_in_face && state->node->opcode == VLIST_OPCODE) {
    uint32_t *ptr;
    n = prf_vertex_list_get_count(state->node);
    ptr = prf_vertex_list_get_list_ptr(state->node);
    for (i = 0; i < n; i++) {
      prf_model_vertex_palette_lookup((prf_model_t*)currmodel,
                                      ptr[i], &vertex);

      array_append_float(vertexarray, vertex.x);
      array_append_float(vertexarray, vertex.y);
      array_append_float(vertexarray, vertex.z);

      if (vertex.has_texture) {
        array_append_float(texcoordarray, vertex.texture[0]);
        array_append_float(texcoordarray, vertex.texture[1]);
      }
      else {
        array_append_float(texcoordarray, 0.0f);
        array_append_float(texcoordarray, 0.0f);
      }
      if (color_per_vertex) {
        if (vertex.flags & 0x2000) {
          array_append_int(colorarray, ((faceset*)facesets[current_index])->packed_color);
        }
        else if (vertex.flags & 0x1000) {
          array_append_int(colorarray, vertex.packed_color);
        }
        else {
          array_append_int(colorarray, my_palette_lookup(state, vertex.color_name_index));
        }
      }
    }
  }
  else if (is_in_face && state->node->opcode == MORPH_VLIST_OPCODE) {
    uint32_t *ptr;
    n = prf_morph_vertex_list_get_count(state->node) * 2;
    ptr = prf_morph_vertex_list_get_list_ptr(state->node);
    for (i = 0; i < n; i += 2) {
      prf_model_vertex_palette_lookup((prf_model_t*)currmodel,
                                       ptr[i], &vertex);

      array_append_float(vertexarray, vertex.x);
      array_append_float(vertexarray, vertex.y);
      array_append_float(vertexarray, vertex.z);

      if (vertex.has_texture) {
        array_append_float(texcoordarray, vertex.texture[0]);
        array_append_float(texcoordarray, vertex.texture[1]);
      }
      else {
        array_append_float(texcoordarray, 0.0f);
        array_append_float(texcoordarray, 0.0f);
      }
      if (color_per_vertex) {
        if (vertex.flags & 0x2000) {
          array_append_int(colorarray, ((faceset*)facesets[current_index])->packed_color);
        }
        else if (vertex.flags & 0x1000) {
          array_append_int(colorarray, vertex.packed_color);
        }
        else {
          array_append_int(colorarray,my_palette_lookup(state, vertex.color_name_index));
        }
      }
    }
  }

  else if (is_in_face && prf_vertex_lookup(state->node, &vertex)) {
    array_append_float(vertexarray, vertex.x);
    array_append_float(vertexarray, vertex.y);
    array_append_float(vertexarray, vertex.z);

    array_append_float(texcoordarray, 0.0f);
    array_append_float(texcoordarray, 0.0f);
    if (color_per_vertex) {
      if (vertex.flags & 0x2000) {
        array_append_int(colorarray, ((faceset*)facesets[current_index])->packed_color);
      }
      else if (vertex.flags & 0x1000) {
        array_append_int(colorarray, vertex.packed_color);
      }
      else {
        array_append_int(colorarray, my_palette_lookup(state, vertex.color_name_index));
      }
    }
  }

  else if (is_in_face && state->node->opcode == POP_OPCODE) {
    float *mat;
    is_in_face = 0;

    mat = (float*) prf_state_get_matrix(state);

    if (array_count(vertexarray) == 1*3) {
      /* points not supported yet */
    }
    else if (array_count(vertexarray) == 2*3) {
#define idx ((faceset*)facesets[current_index])->lineIndices
#define bsp ((faceset*)facesets[current_index])->bspTree
#define colbsp ((faceset*)facesets[current_index])->vertex_colors
#define colidx ((faceset*)facesets[current_index])->colorIdx

      get_coords_3d(vertexarray, 0, tmp);
      mult_matrix_vec(mat, tmp);
      array_append_int(idx, bsp_add_point(bsp, tmp));
      get_coords_3d(vertexarray, 1, tmp);
      mult_matrix_vec(mat, tmp);
      array_append_int(idx, bsp_add_point(bsp, tmp));
      array_append_int(idx, -1);

      if (color_per_vertex) {
        packed_to_vec(colorarray[0], tmp);
        array_append_int(colidx, bsp_add_point(colbsp, tmp));
        packed_to_vec(colorarray[1], tmp);
        array_append_int(colidx, bsp_add_point(colbsp, tmp));
        array_append_int(colidx, -1);
      }
#undef idx
#undef bsp
#undef colbsp
#undef colidx
    }
    else if (array_count(vertexarray) >= 3*3) {

      int dotex = ((faceset*)facesets[current_index])->texture_pattern_index >= 0;

      if (color_per_vertex) {
        assert(array_count(colorarray) == array_count(vertexarray)/3);
      }
      if (dotex) {
        /*
        assert(array_count(texcoordarray) == array_count(vertexarray));
        */
      }
#define idx ((faceset*)facesets[current_index])->indices
#define tidx ((faceset*)facesets[current_index])->texIndices
#define bsp ((faceset*)facesets[current_index])->bspTree
#define colbsp ((faceset*)facesets[current_index])->vertex_colors
#define colidx ((faceset*)facesets[current_index])->colorIdx
#define texcoords ((faceset*)facesets[current_index])->texcoords

      n = array_count(vertexarray) / 3;
      for (i = 0; i < n; i++) {
        get_coords_3d(vertexarray, i ,tmp);
        mult_matrix_vec(mat, tmp);
        array_append_int(idx, bsp_add_point(bsp, tmp));
        if (dotex) {
          get_coords_2d(texcoordarray, i, tmp);
          array_append_int(tidx, bsp_add_point(texcoords, tmp));

        }
        if (color_per_vertex) {
          packed_to_vec(colorarray[i], tmp);
          array_append_int(colidx, bsp_add_point(colbsp, tmp));
        }
      }
      array_append_int(idx, -1);
      if (dotex) array_append_int(tidx, -1);
      if (color_per_vertex) array_append_int(colidx, -1);
    }
#undef idx
#undef tidx
#undef bsp
#undef colbsp
#undef colidx
#undef texcoords
  }
  return PRF_TRAV_CONTINUE;
}